

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  int iVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *pTVar3;
  AsyncStreamFd *pAVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ImmediatePromiseNode<unsigned_long> *pIVar5;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_00;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_01;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_02;
  Disposer *in_R9;
  bool bVar6;
  Own<kj::_::ChainPromiseNode> OVar7;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar8;
  Promise<unsigned_long> PVar9;
  Own<kj::_::PromiseNode> local_70;
  Own<kj::_::PromiseNode> local_60;
  AsyncStreamFd *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 extraout_var;
  
  local_50 = this;
  do {
    while( true ) {
      pPVar2 = (PromiseNode *)read(*(int *)((long)buffer + 0x10),(void *)minBytes,alreadyRead);
      if (-1 < (long)pPVar2) break;
      iVar1 = kj::_::Debug::getOsErrorNumber(true);
      if (iVar1 != -1) {
        if (iVar1 != 0) {
          local_70.disposer = (Disposer *)0x0;
          local_48 = (PromiseFulfiller<void> *)0x0;
          uStack_40 = (Disposer *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)&local_70,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&local_70);
          local_70.disposer = in_R9;
          OVar8 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                            ((kj *)&local_48,(unsigned_long *)&local_70);
          pIVar5 = OVar8.ptr;
          goto LAB_004705f5;
        }
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&local_60);
        pTVar3 = (TransformPromiseNodeBase *)operator_new(0x50);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar3,&local_60,
                   kj::_::
                   TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:329:50),_kj::_::PropagateException>
                   ::anon_class_40_5_00d635ec_for_func::operator());
        (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062cd70;
        pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
        pTVar3[1].dependency.disposer = (Disposer *)minBytes;
        pTVar3[1].dependency.ptr = (PromiseNode *)maxBytes;
        pTVar3[1].continuationTracePtr = (void *)alreadyRead;
        pTVar3[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_R9;
        local_70.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda()#2},kj::_::PropagateException>>
              ::instance;
        local_70.ptr = (PromiseNode *)pTVar3;
        OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_70)
        ;
        pPVar2 = local_70.ptr;
        pIVar5 = (ImmediatePromiseNode<unsigned_long> *)OVar7.ptr;
        *(undefined4 *)
         &(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (undefined4)local_48;
        *(undefined4 *)
         ((long)&(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                 _vptr_AsyncInputStream + 4) = local_48._4_4_;
        *(undefined4 *)
         &(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
          _vptr_AsyncOutputStream = (undefined4)uStack_40;
        *(undefined4 *)
         ((long)&(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream
                 ._vptr_AsyncOutputStream + 4) = uStack_40._4_4_;
        pAVar4 = local_50;
        if ((TransformPromiseNodeBase *)local_70.ptr != (TransformPromiseNodeBase *)0x0) {
          local_70.ptr = (PromiseNode *)0x0;
          iVar1 = (**(local_70.disposer)->_vptr_Disposer)
                            (local_70.disposer,
                             (_func_int *)
                             ((long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode
                             + (long)((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode
                                     [-2]));
          pAVar4 = (AsyncStreamFd *)CONCAT44(extraout_var,iVar1);
          pIVar5 = extraout_RDX;
        }
        pPVar2 = local_60.ptr;
        if (local_60.ptr != (PromiseNode *)0x0) {
          local_60.ptr = (PromiseNode *)0x0;
          iVar1 = (**((EventPort *)&(local_60.disposer)->_vptr_Disposer)->_vptr_EventPort)
                            (local_60.disposer,
                             (_func_int *)
                             ((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2]
                             ));
          pAVar4 = (AsyncStreamFd *)CONCAT44(extraout_var_00,iVar1);
          pIVar5 = extraout_RDX_00;
        }
        goto LAB_004705fd;
      }
    }
    local_70.disposer = in_R9;
    if (pPVar2 == (PromiseNode *)0x0) goto LAB_00470617;
    bVar6 = maxBytes < pPVar2;
    maxBytes = maxBytes - (long)pPVar2;
    if (bVar6 || (PromiseNode *)maxBytes == (PromiseNode *)0x0) {
      local_70.disposer = (Disposer *)((long)&pPVar2->_vptr_PromiseNode + (long)in_R9);
      goto LAB_00470617;
    }
    minBytes = (long)&((Disposer *)minBytes)->_vptr_Disposer + (long)pPVar2;
    alreadyRead = alreadyRead - (long)pPVar2;
    in_R9 = (Disposer *)((long)&pPVar2[-10]._vptr_PromiseNode + (long)(in_R9 + 10));
  } while (*(char *)((long)buffer + 0x70) != '\x01');
  local_70.disposer = in_R9;
  if (*(char *)((long)buffer + 0x71) == '\x01') {
LAB_00470617:
    OVar8 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                      ((kj *)&local_48,(unsigned_long *)&local_70);
    pIVar5 = OVar8.ptr;
LAB_004705f5:
    *(undefined4 *)
     &(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (undefined4)local_48;
    *(undefined4 *)
     ((long)&(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
             _vptr_AsyncInputStream + 4) = local_48._4_4_;
    *(undefined4 *)
     &(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = (undefined4)uStack_40;
    *(undefined4 *)
     ((long)&(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
             _vptr_AsyncOutputStream + 4) = uStack_40._4_4_;
    pAVar4 = local_50;
  }
  else {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&local_60);
    pTVar3 = (TransformPromiseNodeBase *)operator_new(0x50);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar3,&local_60,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:359:54),_kj::_::PropagateException>
               ::anon_class_40_5_00d635ec_for_func::operator());
    (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062cdf8;
    pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
    pTVar3[1].dependency.disposer = (Disposer *)minBytes;
    pTVar3[1].dependency.ptr = (PromiseNode *)maxBytes;
    pTVar3[1].continuationTracePtr = (void *)alreadyRead;
    pTVar3[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_R9;
    local_70.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda()#3},kj::_::PropagateException>>
          ::instance;
    local_70.ptr = (PromiseNode *)pTVar3;
    OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_70);
    pPVar2 = local_70.ptr;
    pIVar5 = (ImmediatePromiseNode<unsigned_long> *)OVar7.ptr;
    *(undefined4 *)
     &(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (undefined4)local_48;
    *(undefined4 *)
     ((long)&(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
             _vptr_AsyncInputStream + 4) = local_48._4_4_;
    *(undefined4 *)
     &(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = (undefined4)uStack_40;
    *(undefined4 *)
     ((long)&(local_50->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
             _vptr_AsyncOutputStream + 4) = uStack_40._4_4_;
    pAVar4 = local_50;
    if ((TransformPromiseNodeBase *)local_70.ptr != (TransformPromiseNodeBase *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      iVar1 = (**(local_70.disposer)->_vptr_Disposer)
                        (local_70.disposer,
                         (_func_int *)
                         ((long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode +
                         (long)((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
      pAVar4 = (AsyncStreamFd *)CONCAT44(extraout_var_01,iVar1);
      pIVar5 = extraout_RDX_01;
    }
    pPVar2 = local_60.ptr;
    if (local_60.ptr != (PromiseNode *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      iVar1 = (**((EventPort *)&(local_60.disposer)->_vptr_Disposer)->_vptr_EventPort)
                        (local_60.disposer,
                         (_func_int *)
                         ((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2]));
      pAVar4 = (AsyncStreamFd *)CONCAT44(extraout_var_02,iVar1);
      pIVar5 = extraout_RDX_02;
    }
  }
LAB_004705fd:
  PVar9.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar9.super_PromiseBase.node.disposer = (Disposer *)pAVar4;
  return (Promise<unsigned_long>)PVar9.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then([=]() {
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      return alreadyRead + n;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead += n;

      KJ_IF_MAYBE(atEnd, observer.atEndHint()) {
        if (*atEnd) {
          // We've already received an indication that the next read() will return EOF, so there's
          // nothing to wait for.
          return alreadyRead;
        } else {
          // As of the last time the event queue was checked, the kernel reported that we were
          // *not* at the end of the stream. It's unlikely that this has changed in the short time
          // it took to handle the event, therefore calling read() now will almost certainly fail
          // with EAGAIN. Moreover, since EOF had not been received as of the last check, we know
          // that even if it was received since then, whenBecomesReadable() will catch that. So,
          // let's go ahead and skip calling read() here and instead go straight to waiting for
          // more input.
          return observer.whenBecomesReadable().then([=]() {
            return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
          });
        }
      } else {
        // The kernel has not indicated one way or the other whether we are likely to be at EOF.
        // In this case we *must* keep calling read() until we either get a return of zero or
        // EAGAIN.
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      }
    }